

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManComputeSlacks(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar4;
  int v;
  
  iVar1 = Gia_ManLevelNum(p);
  p_00 = Gia_ManReverseLevel(p);
  p_01 = Vec_IntAlloc(p->nObjs);
  v = 0;
  do {
    iVar2 = p->nObjs;
    if (iVar2 <= v) {
LAB_002142e7:
      if (p_01->nSize == iVar2) {
        Vec_IntFree(p_00);
        return p_01;
      }
      __assert_fail("Vec_IntSize(vSlacks) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                    ,0x29f,"Vec_Int_t *Gia_ManComputeSlacks(Gia_Man_t *)");
    }
    pGVar4 = Gia_ManObj(p,v);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar2 = p->nObjs;
      goto LAB_002142e7;
    }
    iVar2 = Gia_ObjLevelId(p,v);
    iVar3 = Vec_IntEntry(p_00,v);
    Vec_IntPush(p_01,iVar1 - (iVar3 + iVar2));
    v = v + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManComputeSlacks( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nLevels = Gia_ManLevelNum( p );
    Vec_Int_t * vLevelR = Gia_ManReverseLevel( p );
    Vec_Int_t * vSlacks = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntPush( vSlacks, nLevels - Gia_ObjLevelId(p, i) - Vec_IntEntry(vLevelR, i) );
    assert( Vec_IntSize(vSlacks) == Gia_ManObjNum(p) );
    Vec_IntFree( vLevelR );
    return vSlacks;
}